

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_remove_internal(JSON_Object *object,char *name,parson_bool_t free_value)

{
  size_t sVar1;
  size_t *psVar2;
  uint in_EAX;
  size_t n;
  unsigned_long hash;
  size_t sVar3;
  size_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  JSON_Status JVar8;
  undefined8 uStack_38;
  
  JVar8 = -1;
  if (object != (JSON_Object *)0x0) {
    uStack_38._0_4_ = in_EAX;
    n = strlen(name);
    hash = hash_string(name,n);
    uStack_38 = (ulong)(uint)uStack_38;
    sVar3 = json_object_get_cell_ix(object,name,n,hash,(parson_bool_t *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ != 0) {
      uVar7 = object->cells[sVar3];
      if (free_value != 0) {
        json_value_free(object->values[uVar7]);
      }
      (*parson_free)(object->names[uVar7]);
      sVar1 = object->count;
      uVar5 = sVar1 - 1;
      if (uVar7 < uVar5) {
        object->names[uVar7] = object->names[sVar1 - 1];
        object->values[uVar7] = object->values[sVar1 - 1];
        psVar2 = object->cell_ixs;
        psVar2[uVar7] = psVar2[sVar1 - 1];
        object->hashes[uVar7] = object->hashes[sVar1 - 1];
        psVar4 = object->cells;
        psVar4[psVar2[uVar7]] = uVar7;
        uVar5 = object->count - 1;
      }
      else {
        psVar4 = object->cells;
      }
      object->count = uVar5;
      uVar7 = sVar3;
      for (uVar5 = 0; uVar6 = object->cell_capacity - 1, uVar5 < uVar6; uVar5 = uVar5 + 1) {
        sVar3 = sVar3 + 1 & uVar6;
        sVar1 = psVar4[sVar3];
        if (sVar1 == 0xffffffffffffffff) break;
        uVar6 = uVar6 & object->hashes[sVar1];
        if (((uVar7 < sVar3) && ((uVar6 <= uVar7 || (sVar3 < uVar6)))) ||
           ((sVar3 < uVar7 && ((uVar6 <= uVar7 && (sVar3 < uVar6)))))) {
          object->cell_ixs[sVar1] = uVar7;
          psVar4[uVar7] = psVar4[sVar3];
          uVar7 = sVar3;
        }
      }
      psVar4[uVar7] = 0xffffffffffffffff;
      JVar8 = 0;
    }
  }
  return JVar8;
}

Assistant:

static JSON_Status json_object_remove_internal(JSON_Object *object, const char *name, parson_bool_t free_value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell = 0;
    size_t item_ix = 0;
    size_t last_item_ix = 0;
    size_t i = 0;
    size_t j = 0;
    size_t x = 0;
    size_t k = 0;
    JSON_Value *val = NULL;

    if (object == NULL) {
        return JSONFailure;
    }

    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (!found) {
        return JSONFailure;
    }

    item_ix = object->cells[cell];
    if (free_value) {
        val = object->values[item_ix];
        json_value_free(val);
        val = NULL;
    }

    parson_free(object->names[item_ix]);
    last_item_ix = object->count - 1;
    if (item_ix < last_item_ix) {
        object->names[item_ix] = object->names[last_item_ix];
        object->values[item_ix] = object->values[last_item_ix];
        object->cell_ixs[item_ix] = object->cell_ixs[last_item_ix];
        object->hashes[item_ix] = object->hashes[last_item_ix];
        object->cells[object->cell_ixs[item_ix]] = item_ix;
    }
    object->count--;

    i = cell;
    j = i;
    for (x = 0; x < (object->cell_capacity - 1); x++) {
        j = (j + 1) & (object->cell_capacity - 1);
        if (object->cells[j] == OBJECT_INVALID_IX) {
            break;
        }
        k = object->hashes[object->cells[j]] & (object->cell_capacity - 1);
        if ((j > i && (k <= i || k > j))
         || (j < i && (k <= i && k > j))) {
            object->cell_ixs[object->cells[j]] = i;
            object->cells[i] = object->cells[j];
            i = j;
        }
    }
    object->cells[i] = OBJECT_INVALID_IX;
    return JSONSuccess;
}